

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::initTableDiscard(Dictionary *this)

{
  double dVar1;
  reference pvVar2;
  element_type *peVar3;
  reference pvVar4;
  long in_RDI;
  float fVar5;
  double dVar6;
  real f;
  size_t i;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffff0;
  ulong __n;
  
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_fffffffffffffff0,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
            );
  for (__n = 0; __n < (ulong)(long)*(int *)(in_RDI + 0x58); __n = __n + 1) {
    pvVar2 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                       ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x28)
                        ,__n);
    fVar5 = (float)pvVar2->count / (float)*(long *)(in_RDI + 0x68);
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x159a76);
    dVar6 = sqrt(peVar3->t / (double)fVar5);
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x159aa1);
    dVar1 = peVar3->t;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x40),__n);
    *pvVar4 = (float)(dVar6 + dVar1 / (double)fVar5);
  }
  return;
}

Assistant:

void Dictionary::initTableDiscard() {
  pdiscard_.resize(size_);
  for (size_t i = 0; i < size_; i++) {
    real f = real(words_[i].count) / real(ntokens_);
    pdiscard_[i] = std::sqrt(args_->t / f) + args_->t / f;
  }
}